

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O0

bool RPCAuthorized(string *strAuth,string *strAuthUsernameOut)

{
  string_view str;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  string_view str_00;
  bool bVar1;
  iterator __last;
  iterator b;
  size_type sVar2;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  string_view strUserPass64;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> userpass_data;
  string strUserPass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined1 *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_fffffffffffffec8;
  uint uVar5;
  undefined4 in_stack_fffffffffffffecc;
  size_t in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char __c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar6;
  char *local_b8;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [3];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffe98);
  if (bVar1) {
    bVar6 = 0;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
               (size_type)in_stack_fffffffffffffeb0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,
                                              CONCAT15(in_stack_fffffffffffffead,
                                                       in_stack_fffffffffffffea8))),
                            (char *)in_stack_fffffffffffffea0);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec8) ^ 0xff000000;
    std::__cxx11::string::~string(in_stack_fffffffffffffe98);
    if ((uVar5 & 0x1000000) == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb8);
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0,
                         CONCAT44(in_stack_fffffffffffffecc,uVar5));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8,
                 (char *)in_stack_fffffffffffffeb0);
      str._M_str._0_4_ = in_stack_fffffffffffffee8;
      str._M_len = in_stack_fffffffffffffee0;
      str._M_str._4_4_ = in_stack_fffffffffffffeec;
      sVar4._M_str = in_stack_fffffffffffffed8;
      sVar4._M_len = in_stack_fffffffffffffed0;
      sVar4 = util::TrimStringView(str,sVar4);
      local_b8 = (char *)sVar4._M_len;
      local_b0 = (string *)sVar4._M_str;
      str_00._M_len._7_1_ = in_stack_ffffffffffffff17;
      str_00._M_len._0_7_ = in_stack_ffffffffffffff10;
      str_00._M_str = local_b8;
      DecodeBase64(str_00);
      std::__cxx11::string::string(in_stack_fffffffffffffeb0);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         in_stack_fffffffffffffe98);
      if (bVar1) {
        this = local_a8;
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator->
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe98);
        __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                           (in_stack_fffffffffffffea0);
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator->
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe98);
        b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      (in_stack_fffffffffffffea0);
        __first._M_current._4_4_ = in_stack_fffffffffffffeec;
        __first._M_current._0_4_ = in_stack_fffffffffffffee8;
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8)))
                   ,__first,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             )__last._M_current);
        __c = (char)((uint)in_stack_fffffffffffffeec >> 0x18);
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __last._M_current,__c,(size_type)b._M_current);
        if (sVar2 != 0xffffffffffffffff) {
          sVar2 = 0;
          __n = local_48;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __last._M_current,__c,(size_type)b._M_current);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (this,sVar2,(size_type)__n);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bVar3._M_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     bVar3._M_len);
          std::__cxx11::string::~string(in_stack_fffffffffffffe98);
        }
        bVar1 = TimingResistantEqual<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __last._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           b._M_current);
        if (bVar1) {
          bVar6 = 1;
        }
        else {
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __last._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     b._M_current);
          bVar6 = multiUserAuthorized(local_b0);
          std::__cxx11::string::~string(in_stack_fffffffffffffe98);
        }
      }
      else {
        bVar6 = 0;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffe98);
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffffe98);
    }
    else {
      bVar6 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool RPCAuthorized(const std::string& strAuth, std::string& strAuthUsernameOut)
{
    if (strRPCUserColonPass.empty()) // Belt-and-suspenders measure if InitRPCAuthentication was not called
        return false;
    if (strAuth.substr(0, 6) != "Basic ")
        return false;
    std::string_view strUserPass64 = TrimStringView(std::string_view{strAuth}.substr(6));
    auto userpass_data = DecodeBase64(strUserPass64);
    std::string strUserPass;
    if (!userpass_data) return false;
    strUserPass.assign(userpass_data->begin(), userpass_data->end());

    if (strUserPass.find(':') != std::string::npos)
        strAuthUsernameOut = strUserPass.substr(0, strUserPass.find(':'));

    //Check if authorized under single-user field
    if (TimingResistantEqual(strUserPass, strRPCUserColonPass)) {
        return true;
    }
    return multiUserAuthorized(strUserPass);
}